

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

Status __thiscall
soplex::SPxSolverBase<double>::getBasis
          (SPxSolverBase<double> *this,VarStatus *row,VarStatus *col,int rowsSize,int colsSize)

{
  int iVar1;
  VarStatus VVar2;
  Status SVar3;
  SPxSolverBase<double> *this_00;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int i;
  Desc *d;
  undefined4 in_stack_ffffffffffffffd0;
  
  this_00 = (SPxSolverBase<double> *)
            SPxBasisBase<double>::desc((SPxBasisBase<double> *)(in_RDI + 0x1c8));
  if (in_RDX != 0) {
    iVar1 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x274837);
    while (iVar1 = iVar1 + -1, -1 < iVar1) {
      SPxBasisBase<double>::Desc::colStatus
                ((Desc *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),(int)((ulong)in_RDI >> 0x20));
      VVar2 = basisStatusToVarStatus((SPxSolverBase<double> *)col,rowsSize);
      *(VarStatus *)(in_RDX + (long)iVar1 * 4) = VVar2;
    }
  }
  if (in_RSI != 0) {
    iVar1 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x27488d);
    while (iVar1 = iVar1 + -1, -1 < iVar1) {
      SPxBasisBase<double>::Desc::rowStatus
                ((Desc *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),(int)((ulong)in_RDI >> 0x20));
      VVar2 = basisStatusToVarStatus((SPxSolverBase<double> *)col,rowsSize);
      *(VarStatus *)(in_RSI + (long)iVar1 * 4) = VVar2;
    }
  }
  SVar3 = status(this_00);
  return SVar3;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getBasis(VarStatus row[], VarStatus col[],
         const int rowsSize, const int colsSize) const
   {
      const typename SPxBasisBase<R>::Desc& d = this->desc();
      int i;

      assert(rowsSize < 0 || rowsSize >= this->nRows());
      assert(colsSize < 0 || colsSize >= this->nCols());

      if(col)
         for(i = this->nCols() - 1; i >= 0; --i)
            col[i] = basisStatusToVarStatus(d.colStatus(i));

      if(row)
         for(i = this->nRows() - 1; i >= 0; --i)
            row[i] = basisStatusToVarStatus(d.rowStatus(i));

      return status();
   }